

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_AttachLinsol
              (void *arkode_mem,ARKLinsolInitFn linit,ARKLinsolSetupFn lsetup,
              ARKLinsolSolveFn lsolve,ARKLinsolFreeFn lfree,SUNLinearSolver_Type lsolve_type,
              void *lmem)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_stack_00000008;
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  void *in_stack_ffffffffffffffb8;
  undefined4 local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_stack_ffffffffffffffb8,
                       (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,(ARKodeMRIStepMem *)0x1154472);
  if (local_4 == 0) {
    if (*(long *)((long)in_stack_ffffffffffffffb8 + 0x140) != 0) {
      (**(code **)((long)in_stack_ffffffffffffffb8 + 0x140))(in_RDI);
    }
    *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x128) = in_RSI;
    *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x130) = in_RDX;
    *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x138) = in_RCX;
    *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x140) = in_R8;
    *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x148) = in_stack_00000008;
    *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x178) = 0;
    *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x108) = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mriStep_AttachLinsol(void* arkode_mem, ARKLinsolInitFn linit,
                         ARKLinsolSetupFn lsetup,
                         ARKLinsolSolveFn lsolve,
                         ARKLinsolFreeFn lfree,
                         SUNLinearSolver_Type lsolve_type,
                         void *lmem)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_AttachLinsol",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* free any existing system solver */
  if (step_mem->lfree != NULL)  step_mem->lfree(arkode_mem);

  /* Attach the provided routines, data structure and solve type */
  step_mem->linit  = linit;
  step_mem->lsetup = lsetup;
  step_mem->lsolve = lsolve;
  step_mem->lfree  = lfree;
  step_mem->lmem   = lmem;

  /* Reset all linear solver counters */
  step_mem->nsetups = 0;
  step_mem->nstlp   = 0;

  return(ARK_SUCCESS);
}